

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O3

char * mp_get_hex_internal(mp_int *x,uint8_t letter_offset)

{
  byte bVar1;
  char *buf;
  long lVar2;
  long lVar3;
  ulong uVar4;
  byte bVar5;
  
  lVar3 = x->nw * 0x10;
  buf = (char *)safemalloc(lVar3 + 1U,1,0);
  buf[lVar3] = '\0';
  if (lVar3 != 0) {
    bVar1 = 0;
    uVar4 = 0;
    lVar2 = lVar3;
    do {
      bVar5 = (byte)(x->w[uVar4 >> 4] >> (bVar1 & 0x3c)) & 0xf;
      buf[lVar2 + -1] = (-((byte)(bVar5 + 6) >> 4) & letter_offset) + bVar5 + '0';
      uVar4 = uVar4 + 1;
      bVar1 = bVar1 + 4;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  trim_leading_zeroes(buf,lVar3 + 1U,lVar3 - 1);
  return buf;
}

Assistant:

static char *mp_get_hex_internal(mp_int *x, uint8_t letter_offset)
{
    size_t nibbles = x->nw * BIGNUM_INT_BYTES * 2;
    size_t bufsize = nibbles + 1;
    char *outbuf = snewn(bufsize, char);
    outbuf[nibbles] = '\0';

    for (size_t nibble = 0; nibble < nibbles; nibble++) {
        size_t word_idx = nibble / (BIGNUM_INT_BYTES*2);
        size_t nibble_within_word = nibble % (BIGNUM_INT_BYTES*2);
        uint8_t digitval = 0xF & (x->w[word_idx] >> (nibble_within_word * 4));

        uint8_t mask = -((digitval + 6) >> 4);
        char digit = digitval + '0' + (letter_offset & mask);
        outbuf[nibbles-1 - nibble] = digit;
    }

    trim_leading_zeroes(outbuf, bufsize, nibbles - 1);
    return outbuf;
}